

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O2

ChVariablesBodyOwnMass * __thiscall
chrono::ChVariablesBodyOwnMass::operator=
          (ChVariablesBodyOwnMass *this,ChVariablesBodyOwnMass *other)

{
  if (other != this) {
    ChVariablesBody::operator=(&this->super_ChVariablesBody,&other->super_ChVariablesBody);
    this->mass = other->mass;
    this->inv_mass = other->inv_mass;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&(this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>,
               &(other->inertia).super_Matrix<double,_3,_3,_1,_3,_3>);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&(this->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>,
               &(other->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>);
  }
  return this;
}

Assistant:

ChVariablesBodyOwnMass& ChVariablesBodyOwnMass::operator=(const ChVariablesBodyOwnMass& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariablesBody::operator=(other);

    // copy class data
    mass = other.mass;
    inv_mass = other.inv_mass;

    inertia = other.inertia;
    inv_inertia = other.inv_inertia;

    return *this;
}